

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase105::run(TestCase105 *this)

{
  PointerType PVar1;
  int iVar2;
  Reader RVar3;
  Reader value;
  Fault f;
  Fault f_2;
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> orphan;
  Builder root;
  Builder list;
  MallocMessageBuilder builder;
  ListReader local_238;
  undefined1 local_208 [36];
  ushort local_1e4;
  int local_1e0;
  PointerReader local_1d8;
  ushort local_1b4;
  int local_1b0;
  OrphanBuilder local_1a8;
  PointerReader local_188;
  StructBuilder local_168;
  ArrayPtr<const_char> local_140;
  ListBuilder local_130;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_208,&local_108.super_MessageBuilder);
  local_238.ptr = (byte *)local_208._16_8_;
  local_238.segment = (SegmentReader *)local_208._0_8_;
  local_238.capTable = (CapTableReader *)local_208._8_8_;
  PointerBuilder::initStruct(&local_168,(PointerBuilder *)&local_238,(StructSize)0x140006);
  local_238.ptr = (byte *)(local_168.pointers + 0x11);
  local_238.segment = &(local_168.segment)->super_SegmentReader;
  local_238.capTable = &(local_168.capTable)->super_CapTableReader;
  PointerBuilder::initStructList(&local_130,(PointerBuilder *)&local_238,2,(StructSize)0x140006);
  ListBuilder::getStructElement((StructBuilder *)&local_238,&local_130,0);
  local_208._0_8_ = local_238.segment;
  local_208._8_8_ = local_238.capTable;
  RVar3.super_StringPtr.content.size_ = 4;
  RVar3.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_208,RVar3);
  ListBuilder::getStructElement((StructBuilder *)&local_238,&local_130,1);
  local_208._0_8_ = local_238.segment;
  local_208._8_8_ = local_238.capTable;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_208,value);
  local_238.ptr = (byte *)(local_168.pointers + 0x11);
  local_238.segment = &(local_168.segment)->super_SegmentReader;
  local_238.capTable = &(local_168.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_238);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x70,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  local_208._16_8_ = local_168.pointers + 0x11;
  local_208._0_8_ = local_168.segment;
  local_208._8_8_ = local_168.capTable;
  PointerBuilder::disown((OrphanBuilder *)&local_238,(PointerBuilder *)local_208);
  local_1a8.capTable = (CapTableBuilder *)local_238.ptr;
  local_1a8.location = (word *)CONCAT44(local_238.step,local_238.elementCount);
  local_1a8.tag.content = (uint64_t)local_238.segment;
  local_1a8.segment = (SegmentBuilder *)local_238.capTable;
  if ((local_1a8.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x73,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
               (char (*) [38])"failed: expected !(orphan == nullptr)");
  }
  OrphanBuilder::asListReader(&local_238,&local_1a8,INLINE_COMPOSITE);
  if (local_238.elementCount != 2) {
    local_1d8.segment = (SegmentReader *)CONCAT44(local_1d8.segment._4_4_,2);
    OrphanBuilder::asListReader(&local_238,&local_1a8,INLINE_COMPOSITE);
    local_188.segment._0_4_ = local_238.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)local_208,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x75,FAILED,"(2u) == (orphan.getReader().size())","2u, orphan.getReader().size()",
               (uint *)&local_1d8,(uint *)&local_188);
    kj::_::Debug::Fault::fatal((Fault *)local_208);
  }
  OrphanBuilder::asListReader((ListReader *)local_208,&local_1a8,INLINE_COMPOSITE);
  ListReader::getStructElement((StructReader *)&local_238,(ListReader *)local_208,0);
  if (local_238.structPointerCount == 0) {
    local_1d8.nestingLimit = 0x7fffffff;
    local_1d8.capTable = (CapTableReader *)0x0;
    local_1d8.pointer = (WirePointer *)0x0;
    local_1d8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1d8.pointer = (WirePointer *)CONCAT44(local_238.step,local_238.elementCount);
    local_1d8.capTable = local_238.capTable;
    local_1d8.segment = local_238.segment;
    local_1d8.nestingLimit = local_238.nestingLimit;
  }
  RVar3 = PointerReader::getBlob<capnp::Text>(&local_1d8,(void *)0x0,0);
  if (((RVar3.super_StringPtr.content.size_ != 4) ||
      (iVar2 = bcmp(RVar3.super_StringPtr.content.ptr,"foo",3), iVar2 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    OrphanBuilder::asListReader((ListReader *)local_208,&local_1a8,INLINE_COMPOSITE);
    ListReader::getStructElement((StructReader *)&local_238,(ListReader *)local_208,0);
    if (local_238.structPointerCount == 0) {
      local_1d8.nestingLimit = 0x7fffffff;
      local_1d8.capTable = (CapTableReader *)0x0;
      local_1d8.pointer = (WirePointer *)0x0;
      local_1d8.segment = (SegmentReader *)0x0;
    }
    else {
      local_1d8.pointer = (WirePointer *)CONCAT44(local_238.step,local_238.elementCount);
      local_1d8.capTable = local_238.capTable;
      local_1d8.segment = local_238.segment;
      local_1d8.nestingLimit = local_238.nestingLimit;
    }
    local_188._0_16_ = PointerReader::getBlob<capnp::Text>(&local_1d8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[67],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (orphan.getReader()[0].getTextField())\", \"foo\", orphan.getReader()[0].getTextField()"
               ,(char (*) [67])
                "failed: expected (\"foo\") == (orphan.getReader()[0].getTextField())",
               (char (*) [4])"foo",(Reader *)&local_188);
  }
  OrphanBuilder::asListReader((ListReader *)local_208,&local_1a8,INLINE_COMPOSITE);
  ListReader::getStructElement((StructReader *)&local_238,(ListReader *)local_208,1);
  if (local_238.structPointerCount == 0) {
    local_1d8.nestingLimit = 0x7fffffff;
    local_1d8.capTable = (CapTableReader *)0x0;
    local_1d8.pointer = (WirePointer *)0x0;
    local_1d8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1d8.pointer = (WirePointer *)CONCAT44(local_238.step,local_238.elementCount);
    local_1d8.capTable = local_238.capTable;
    local_1d8.segment = local_238.segment;
    local_1d8.nestingLimit = local_238.nestingLimit;
  }
  RVar3 = PointerReader::getBlob<capnp::Text>(&local_1d8,(void *)0x0,0);
  if (((RVar3.super_StringPtr.content.size_ != 4) ||
      (iVar2 = bcmp(RVar3.super_StringPtr.content.ptr,"bar",3), iVar2 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    OrphanBuilder::asListReader((ListReader *)local_208,&local_1a8,INLINE_COMPOSITE);
    ListReader::getStructElement((StructReader *)&local_238,(ListReader *)local_208,1);
    if (local_238.structPointerCount == 0) {
      local_1d8.nestingLimit = 0x7fffffff;
      local_1d8.capTable = (CapTableReader *)0x0;
      local_1d8.pointer = (WirePointer *)0x0;
      local_1d8.segment = (SegmentReader *)0x0;
    }
    else {
      local_1d8.pointer = (WirePointer *)CONCAT44(local_238.step,local_238.elementCount);
      local_1d8.capTable = local_238.capTable;
      local_1d8.segment = local_238.segment;
      local_1d8.nestingLimit = local_238.nestingLimit;
    }
    local_188._0_16_ = PointerReader::getBlob<capnp::Text>(&local_1d8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[67],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x77,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (orphan.getReader()[1].getTextField())\", \"bar\", orphan.getReader()[1].getTextField()"
               ,(char (*) [67])
                "failed: expected (\"bar\") == (orphan.getReader()[1].getTextField())",
               (char (*) [4])0x2be72e,(Reader *)&local_188);
  }
  OrphanBuilder::asStructList((ListBuilder *)&local_238,&local_1a8,(StructSize)0x140006);
  if (local_238.elementCount != 2) {
    local_1d8.segment = (SegmentReader *)CONCAT44(local_1d8.segment._4_4_,2);
    OrphanBuilder::asStructList((ListBuilder *)&local_238,&local_1a8,(StructSize)0x140006);
    local_188.segment._0_4_ = local_238.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)local_208,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x78,FAILED,"(2u) == (orphan.get().size())","2u, orphan.get().size()",
               (uint *)&local_1d8,(uint *)&local_188);
    kj::_::Debug::Fault::fatal((Fault *)local_208);
  }
  OrphanBuilder::asStructList((ListBuilder *)local_208,&local_1a8,(StructSize)0x140006);
  ListBuilder::getStructElement((StructBuilder *)&local_238,(ListBuilder *)local_208,0);
  local_1d8.segment = local_238.segment;
  local_1d8.capTable = local_238.capTable;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_188,(PointerBuilder *)&local_1d8,(void *)0x0,0);
  if (local_188.pointer == (WirePointer *)0x4) {
    iVar2 = bcmp(local_188.capTable,"foo",3);
    if (iVar2 != 0) goto joined_r0x001fa1fa;
  }
  else {
joined_r0x001fa1fa:
    if (kj::_::Debug::minSeverity < 3) {
      OrphanBuilder::asStructList((ListBuilder *)local_208,&local_1a8,(StructSize)0x140006);
      ListBuilder::getStructElement((StructBuilder *)&local_238,(ListBuilder *)local_208,0);
      local_1d8.segment = local_238.segment;
      local_1d8.capTable = local_238.capTable;
      PointerBuilder::getBlob<capnp::Text>
                ((Builder *)&local_188,(PointerBuilder *)&local_1d8,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[61],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x79,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (orphan.get()[0].getTextField())\", \"foo\", orphan.get()[0].getTextField()"
                 ,(char (*) [61])"failed: expected (\"foo\") == (orphan.get()[0].getTextField())",
                 (char (*) [4])"foo",(Builder *)&local_188);
    }
  }
  OrphanBuilder::asStructList((ListBuilder *)local_208,&local_1a8,(StructSize)0x140006);
  ListBuilder::getStructElement((StructBuilder *)&local_238,(ListBuilder *)local_208,1);
  local_1d8.segment = local_238.segment;
  local_1d8.capTable = local_238.capTable;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_188,(PointerBuilder *)&local_1d8,(void *)0x0,0);
  if (local_188.pointer == (WirePointer *)0x4) {
    iVar2 = bcmp(local_188.capTable,"bar",3);
    if (iVar2 == 0) goto LAB_001fa39c;
  }
  if (kj::_::Debug::minSeverity < 3) {
    OrphanBuilder::asStructList((ListBuilder *)local_208,&local_1a8,(StructSize)0x140006);
    ListBuilder::getStructElement((StructBuilder *)&local_238,(ListBuilder *)local_208,1);
    local_1d8.segment = local_238.segment;
    local_1d8.capTable = local_238.capTable;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_188,(PointerBuilder *)&local_1d8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[61],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (orphan.get()[1].getTextField())\", \"bar\", orphan.get()[1].getTextField()"
               ,(char (*) [61])"failed: expected (\"bar\") == (orphan.get()[1].getTextField())",
               (char (*) [4])0x2be72e,(Builder *)&local_188);
  }
LAB_001fa39c:
  local_238.ptr = (byte *)(local_168.pointers + 0x11);
  local_238.segment = &(local_168.segment)->super_SegmentReader;
  local_238.capTable = &(local_168.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_238);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x7b,ERROR,"\"failed: expected \" \"!(root.hasStructList())\"",
               (char (*) [41])"failed: expected !(root.hasStructList())");
  }
  local_238.ptr = (byte *)(local_168.pointers + 0x11);
  local_238.segment = &(local_168.segment)->super_SegmentReader;
  local_238.capTable = &(local_168.capTable)->super_CapTableReader;
  PointerBuilder::adopt((PointerBuilder *)&local_238,&local_1a8);
  if ((local_1a8.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x7e,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  local_238.ptr = (byte *)(local_168.pointers + 0x11);
  local_238.segment = &(local_168.segment)->super_SegmentReader;
  local_238.capTable = &(local_168.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_238);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x7f,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  StructBuilder::asReader(&local_168);
  if (local_1e4 < 0x12) {
    local_1e0 = 0x7fffffff;
    local_1d8.capTable = (CapTableReader *)0x0;
    local_1d8.pointer = (WirePointer *)0x0;
    local_1d8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1d8.pointer = (WirePointer *)(local_208._24_8_ + 0x88);
    local_1d8.capTable = (CapTableReader *)local_208._8_8_;
    local_1d8.segment = (SegmentReader *)local_208._0_8_;
  }
  local_1d8.nestingLimit = local_1e0;
  PointerReader::getList(&local_238,&local_1d8,INLINE_COMPOSITE,(word *)0x0);
  if (local_238.elementCount == 2) {
    StructBuilder::asReader(&local_168);
    if (local_1b4 < 0x12) {
      local_188.nestingLimit = 0x7fffffff;
      local_188.capTable = (CapTableReader *)0x0;
      local_188.pointer = (WirePointer *)0x0;
      local_188.segment = (SegmentReader *)0x0;
    }
    else {
      local_188.pointer = (WirePointer *)(CONCAT44(local_1d8._28_4_,local_1d8.nestingLimit) + 0x88);
      local_188.capTable = local_1d8.capTable;
      local_188.segment = local_1d8.segment;
      local_188.nestingLimit = local_1b0;
    }
    PointerReader::getList((ListReader *)local_208,&local_188,INLINE_COMPOSITE,(word *)0x0);
    ListReader::getStructElement((StructReader *)&local_238,(ListReader *)local_208,0);
    if (local_238.structPointerCount == 0) {
      local_188.nestingLimit = 0x7fffffff;
      local_188.capTable = (CapTableReader *)0x0;
      local_188.pointer = (WirePointer *)0x0;
      local_188.segment = (SegmentReader *)0x0;
    }
    else {
      local_188.pointer = (WirePointer *)CONCAT44(local_238.step,local_238.elementCount);
      local_188.capTable = local_238.capTable;
      local_188.segment = local_238.segment;
      local_188.nestingLimit = local_238.nestingLimit;
    }
    RVar3 = PointerReader::getBlob<capnp::Text>(&local_188,(void *)0x0,0);
    if (((RVar3.super_StringPtr.content.size_ != 4) ||
        (iVar2 = bcmp(RVar3.super_StringPtr.content.ptr,"foo",3), iVar2 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      StructBuilder::asReader(&local_168);
      if (local_1b4 < 0x12) {
        local_188.nestingLimit = 0x7fffffff;
        local_188.capTable = (CapTableReader *)0x0;
        local_188.pointer = (WirePointer *)0x0;
        local_188.segment = (SegmentReader *)0x0;
      }
      else {
        local_188.pointer =
             (WirePointer *)(CONCAT44(local_1d8._28_4_,local_1d8.nestingLimit) + 0x88);
        local_188.capTable = local_1d8.capTable;
        local_188.segment = local_1d8.segment;
        local_188.nestingLimit = local_1b0;
      }
      PointerReader::getList((ListReader *)local_208,&local_188,INLINE_COMPOSITE,(word *)0x0);
      ListReader::getStructElement((StructReader *)&local_238,(ListReader *)local_208,0);
      if (local_238.structPointerCount == 0) {
        local_188.nestingLimit = 0x7fffffff;
        local_188.capTable = (CapTableReader *)0x0;
        local_188.pointer = (WirePointer *)0x0;
        local_188.segment = (SegmentReader *)0x0;
      }
      else {
        local_188.pointer = (WirePointer *)CONCAT44(local_238.step,local_238.elementCount);
        local_188.capTable = local_238.capTable;
        local_188.segment = local_238.segment;
        local_188.nestingLimit = local_238.nestingLimit;
      }
      local_140 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>(&local_188,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[80],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x81,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.asReader().getStructList()[0].getTextField())\", \"foo\", root.asReader().getStructList()[0].getTextField()"
                 ,(char (*) [80])
                  "failed: expected (\"foo\") == (root.asReader().getStructList()[0].getTextField())"
                 ,(char (*) [4])"foo",(Reader *)&local_140);
    }
    StructBuilder::asReader(&local_168);
    if (local_1b4 < 0x12) {
      local_188.nestingLimit = 0x7fffffff;
      local_188.capTable = (CapTableReader *)0x0;
      local_188.pointer = (WirePointer *)0x0;
      local_188.segment = (SegmentReader *)0x0;
    }
    else {
      local_188.pointer = (WirePointer *)(CONCAT44(local_1d8._28_4_,local_1d8.nestingLimit) + 0x88);
      local_188.capTable = local_1d8.capTable;
      local_188.segment = local_1d8.segment;
      local_188.nestingLimit = local_1b0;
    }
    PointerReader::getList((ListReader *)local_208,&local_188,INLINE_COMPOSITE,(word *)0x0);
    ListReader::getStructElement((StructReader *)&local_238,(ListReader *)local_208,1);
    if (local_238.structPointerCount == 0) {
      local_188.nestingLimit = 0x7fffffff;
      local_188.capTable = (CapTableReader *)0x0;
      local_188.pointer = (WirePointer *)0x0;
      local_188.segment = (SegmentReader *)0x0;
    }
    else {
      local_188.pointer = (WirePointer *)CONCAT44(local_238.step,local_238.elementCount);
      local_188.capTable = local_238.capTable;
      local_188.segment = local_238.segment;
      local_188.nestingLimit = local_238.nestingLimit;
    }
    RVar3 = PointerReader::getBlob<capnp::Text>(&local_188,(void *)0x0,0);
    if (((RVar3.super_StringPtr.content.size_ != 4) ||
        (iVar2 = bcmp(RVar3.super_StringPtr.content.ptr,"bar",3), iVar2 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      StructBuilder::asReader(&local_168);
      if (local_1b4 < 0x12) {
        local_1b0 = 0x7fffffff;
        local_188.capTable = (CapTableReader *)0x0;
        local_188.pointer = (WirePointer *)0x0;
        local_188.segment = (SegmentReader *)0x0;
      }
      else {
        local_188.pointer =
             (WirePointer *)(CONCAT44(local_1d8._28_4_,local_1d8.nestingLimit) + 0x88);
        local_188.capTable = local_1d8.capTable;
        local_188.segment = local_1d8.segment;
      }
      local_188.nestingLimit = local_1b0;
      PointerReader::getList((ListReader *)local_208,&local_188,INLINE_COMPOSITE,(word *)0x0);
      ListReader::getStructElement((StructReader *)&local_238,(ListReader *)local_208,1);
      if (local_238.structPointerCount == 0) {
        local_238.nestingLimit = 0x7fffffff;
        local_188.capTable = (CapTableReader *)0x0;
        local_188.pointer = (WirePointer *)0x0;
        local_188.segment = (SegmentReader *)0x0;
      }
      else {
        local_188.pointer = (WirePointer *)CONCAT44(local_238.step,local_238.elementCount);
        local_188.capTable = local_238.capTable;
        local_188.segment = local_238.segment;
      }
      local_188.nestingLimit = local_238.nestingLimit;
      local_140 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>(&local_188,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[80],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x82,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (root.asReader().getStructList()[1].getTextField())\", \"bar\", root.asReader().getStructList()[1].getTextField()"
                 ,(char (*) [80])
                  "failed: expected (\"bar\") == (root.asReader().getStructList()[1].getTextField())"
                 ,(char (*) [4])0x2be72e,(Reader *)&local_140);
    }
    if (local_1a8.segment != (SegmentBuilder *)0x0) {
      OrphanBuilder::euthanize(&local_1a8);
    }
    MallocMessageBuilder::~MallocMessageBuilder(&local_108);
    return;
  }
  local_188.segment._0_4_ = 2;
  StructBuilder::asReader(&local_168);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
            ((Reader *)&local_238,(Reader *)local_208);
  local_140.ptr._0_4_ = local_238.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            ((Fault *)&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0x80,FAILED,"(2u) == (root.asReader().getStructList().size())",
             "2u, root.asReader().getStructList().size()",(uint *)&local_188,(uint *)&local_140);
  kj::_::Debug::Fault::fatal((Fault *)&local_1d8);
}

Assistant:

TEST(Orphans, StructLists) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  auto list = root.initStructList(2);
  list[0].setTextField("foo");
  list[1].setTextField("bar");
  EXPECT_TRUE(root.hasStructList());

  Orphan<List<TestAllTypes>> orphan = root.disownStructList();
  EXPECT_FALSE(orphan == nullptr);

  ASSERT_EQ(2u, orphan.getReader().size());
  EXPECT_EQ("foo", orphan.getReader()[0].getTextField());
  EXPECT_EQ("bar", orphan.getReader()[1].getTextField());
  ASSERT_EQ(2u, orphan.get().size());
  EXPECT_EQ("foo", orphan.get()[0].getTextField());
  EXPECT_EQ("bar", orphan.get()[1].getTextField());
  EXPECT_FALSE(root.hasStructList());

  root.adoptStructList(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasStructList());
  ASSERT_EQ(2u, root.asReader().getStructList().size());
  EXPECT_EQ("foo", root.asReader().getStructList()[0].getTextField());
  EXPECT_EQ("bar", root.asReader().getStructList()[1].getTextField());
}